

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O3

void __thiscall
TTD::ExecutionInfoManager::LoadPreservedBPInfo
          (ExecutionInfoManager *this,ThreadContext *threadContext)

{
  ulong uVar1;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  ScriptContext **ppSVar2;
  uint uVar3;
  ulong uVar4;
  TrackAllocData data;
  TElementType local_70;
  List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  bpIdsToDelete;
  ULONG srcLine;
  LONG srcColumn;
  
  uVar3 = (this->m_unRestoredBreakpoints).
          super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
          .count;
  bpIdsToDelete._40_8_ = this;
  if (0 < (int)uVar3) {
    do {
      if (**(long **)(bpIdsToDelete._40_8_ + 0x200) != 0) {
        uVar1 = 1;
        do {
          uVar4 = uVar1;
          if (uVar3 == uVar4) break;
          uVar1 = uVar4 + 1;
        } while ((*(long **)(bpIdsToDelete._40_8_ + 0x200))[uVar4] != 0);
        if (uVar3 <= uVar4) break;
      }
      local_70 = (TElementType)0x0;
      Js::
      CopyRemovePolicy<JsUtil::List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
      ::Remove((CopyRemovePolicy<JsUtil::List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
                *)&(this->m_unRestoredBreakpoints).field_0x28,&this->m_unRestoredBreakpoints,
               &local_70);
      uVar3 = *(uint *)(bpIdsToDelete._40_8_ + 0x208);
    } while (0 < (int)uVar3);
  }
  this_00 = ThreadContextTTD::GetTTDContexts(threadContext->TTDContext);
  if (0 < (this_00->super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>)
          .count) {
    ppSVar2 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
              Item(&this_00->
                    super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>,
                   0);
    bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>._16_8_ =
         &Memory::HeapAllocator::Instance;
    local_70 = (TElementType)&PTR_IsReadOnly_014e5348;
    bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.
    _vptr_ReadOnlyList = (_func_int **)0x0;
    bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.buffer.
    _0_4_ = 0;
    bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.alloc =
         (Type)0x400000000;
    Js::ScriptContext::GetDebugContext(*ppSVar2);
  }
  return;
}

Assistant:

void ExecutionInfoManager::LoadPreservedBPInfo(ThreadContext* threadContext)
    {
        while(this->m_unRestoredBreakpoints.Contains(nullptr))
        {
            this->m_unRestoredBreakpoints.Remove(nullptr);
        }

        const JsUtil::List<Js::ScriptContext*, HeapAllocator>& ctxs = threadContext->TTDContext->GetTTDContexts();
        for(int32 i = 0; i < ctxs.Count(); ++i)
        {
            Js::ScriptContext* ctx = ctxs.Item(i);
            JsUtil::List<uint32, HeapAllocator> bpIdsToDelete(&HeapAllocator::Instance);

            Js::ProbeContainer* probeContainer = ctx->GetDebugContext()->GetProbeContainer();
            probeContainer->MapProbes([&](int j, Js::Probe* pProbe)
            {
                Js::BreakpointProbe* bp = (Js::BreakpointProbe*)pProbe;
                if((int64)bp->GetId() != this->m_activeBPId)
                {
                    Js::FunctionBody* body = bp->GetFunctionBody();
                    int32 bpIndex = body->GetEnclosingStatementIndexFromByteCode(bp->GetBytecodeOffset());

                    ULONG srcLine = 0;
                    LONG srcColumn = -1;
                    uint32 startOffset = body->GetStatementStartOffset(bpIndex);
                    body->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

                    TTDebuggerSourceLocation* bpLocation = TT_HEAP_NEW(TTDebuggerSourceLocation);
                    bpLocation->SetLocationWithBP(bp->GetId(), body, srcLine, srcColumn);
                    this->m_unRestoredBreakpoints.Add(bpLocation);

                    bpIdsToDelete.Add(bp->GetId());
                }
            });

            for(int32 j = 0; j < bpIdsToDelete.Count(); ++j)
            {
                ctx->TTDHostCallbackFunctor.pfOnBPDeleteCallback(ctx->TTDHostCallbackFunctor.HostRuntime, bpIdsToDelete.Item(j));
            }

            //done with last context so release the debug document dictionary info
            if(i == ctxs.Count() - 1)
            {
                ctx->TTDHostCallbackFunctor.pfOnBPClearDocumentCallback(ctx->TTDHostCallbackFunctor.HostRuntime);
            }
        }
    }